

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  pointer pcVar1;
  pointer pcVar2;
  ExtensionGenerator *pEVar3;
  MessageGenerator *pMVar4;
  Context *pCVar5;
  GeneratorFactory *pGVar6;
  int iVar7;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar8;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar9;
  FileDescriptor *pFVar10;
  long *plVar11;
  char *__function;
  long lVar12;
  long lVar13;
  int bytecode_estimate;
  int method_num;
  int static_block_bytecode_estimate;
  int local_88 [2];
  undefined1 local_80 [80];
  undefined4 extraout_var;
  
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",*(string **)this->file_);
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print(printer,"package $package$;\n\n","package",&this->java_package_);
  }
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  if ((this->options_).annotate_code == true) {
    pcVar2 = (this->classname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (this->classname_)._M_string_length);
    std::__cxx11::string::append((char *)local_80);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
  }
  PrintGeneratedAnnotation(printer,'$',(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  io::Printer::Print(printer,"public final class $classname$ {\n  private $ctor$() {}\n","classname"
                     ,&this->classname_,"ctor",&this->classname_);
  io::Printer::Annotate(printer,"classname","classname",*(string **)this->file_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
                    );
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->file_ + 0x88)) {
    lVar12 = 0;
    do {
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar12);
      pEVar3 = psVar8->ptr_;
      if (pEVar3 == (ExtensionGenerator *)0x0) goto LAB_0026c3b9;
      (*pEVar3->_vptr_ExtensionGenerator[4])(pEVar3,printer);
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this->file_ + 0x88));
  }
  if (0 < *(int *)(this->file_ + 0x58)) {
    lVar12 = 0;
    do {
      psVar9 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar12);
      pMVar4 = psVar9->ptr_;
      if (pMVar4 == (MessageGenerator *)0x0) goto LAB_0026c3a2;
      (*pMVar4->_vptr_MessageGenerator[6])(pMVar4,printer);
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this->file_ + 0x58));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  pCVar5 = (this->context_).ptr_;
  if (pCVar5 != (Context *)0x0) {
    if (((pCVar5->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
      io::Printer::Print(printer,
                         "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
                        );
    }
    if (*(char *)(*(long *)(this->file_ + 0xa0) + 0xa0) == '\0') {
      pFVar10 = this->file_;
      if (0 < *(int *)(pFVar10 + 0x68)) {
        lVar12 = 0;
        lVar13 = 0;
        do {
          pCVar5 = (this->context_).ptr_;
          if (pCVar5 == (Context *)0x0) goto LAB_0026c3d0;
          if (((pCVar5->options_).enforce_lite == false) &&
             (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) {
            EnumGenerator::EnumGenerator
                      ((EnumGenerator *)local_80,
                       (EnumDescriptor *)(*(long *)(pFVar10 + 0x70) + lVar12),this->immutable_api_,
                       pCVar5);
            EnumGenerator::Generate((EnumGenerator *)local_80,printer);
            EnumGenerator::~EnumGenerator((EnumGenerator *)local_80);
          }
          else {
            EnumLiteGenerator::EnumLiteGenerator
                      ((EnumLiteGenerator *)local_80,
                       (EnumDescriptor *)(*(long *)(pFVar10 + 0x70) + lVar12),this->immutable_api_,
                       pCVar5);
            EnumLiteGenerator::Generate((EnumLiteGenerator *)local_80,printer);
            EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_80);
          }
          lVar13 = lVar13 + 1;
          pFVar10 = this->file_;
          lVar12 = lVar12 + 0x38;
        } while (lVar13 < *(int *)(pFVar10 + 0x68));
      }
      pFVar10 = this->file_;
      if (0 < *(int *)(pFVar10 + 0x58)) {
        lVar12 = 0;
        do {
          psVar9 = internal::
                   scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                   ::operator[](&this->message_generators_,lVar12);
          pMVar4 = psVar9->ptr_;
          if (pMVar4 == (MessageGenerator *)0x0) goto LAB_0026c3a2;
          (*pMVar4->_vptr_MessageGenerator[5])(pMVar4,printer);
          psVar9 = internal::
                   scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                   ::operator[](&this->message_generators_,lVar12);
          pMVar4 = psVar9->ptr_;
          if (pMVar4 == (MessageGenerator *)0x0) goto LAB_0026c3a2;
          (*pMVar4->_vptr_MessageGenerator[4])(pMVar4,printer);
          lVar12 = lVar12 + 1;
          pFVar10 = this->file_;
        } while (lVar12 < *(int *)(pFVar10 + 0x58));
      }
      pCVar5 = (this->context_).ptr_;
      if (pCVar5 == (Context *)0x0) goto LAB_0026c3d0;
      if ((((0 < *(int *)(pFVar10 + 0x78)) && ((pCVar5->options_).enforce_lite == false)) &&
          (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) &&
         ((*(char *)(*(long *)(pFVar10 + 0xa0) + 0xa4) == '\x01' &&
          (pFVar10 = this->file_, 0 < *(int *)(pFVar10 + 0x78))))) {
        lVar12 = 0;
        lVar13 = 0;
        do {
          pGVar6 = (this->generator_factory_).ptr_;
          if (pGVar6 == (GeneratorFactory *)0x0) {
            __function = 
            "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->() const [C = google::protobuf::compiler::java::GeneratorFactory]"
            ;
            goto LAB_0026c3e5;
          }
          iVar7 = (*pGVar6->_vptr_GeneratorFactory[4])(pGVar6,*(long *)(pFVar10 + 0x80) + lVar12);
          plVar11 = (long *)CONCAT44(extraout_var,iVar7);
          if (plVar11 == (long *)0x0) {
            __function = 
            "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::operator->() const [C = google::protobuf::compiler::java::ServiceGenerator]"
            ;
            goto LAB_0026c3e5;
          }
          (**(code **)(*plVar11 + 0x10))(plVar11,printer);
          (**(code **)(*plVar11 + 8))(plVar11);
          lVar13 = lVar13 + 1;
          pFVar10 = this->file_;
          lVar12 = lVar12 + 0x30;
        } while (lVar13 < *(int *)(pFVar10 + 0x78));
      }
    }
    if (0 < *(int *)(this->file_ + 0x88)) {
      lVar12 = 0;
      do {
        psVar8 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
                 ::operator[](&this->extension_generators_,lVar12);
        pEVar3 = psVar8->ptr_;
        if (pEVar3 == (ExtensionGenerator *)0x0) goto LAB_0026c3b9;
        (*pEVar3->_vptr_ExtensionGenerator[2])(pEVar3,printer);
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(this->file_ + 0x88));
    }
    local_80._0_8_ = local_80._0_8_ & 0xffffffff00000000;
    if (0 < *(int *)(this->file_ + 0x58)) {
      lVar12 = 0;
      do {
        psVar9 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar12);
        pMVar4 = psVar9->ptr_;
        if (pMVar4 == (MessageGenerator *)0x0) goto LAB_0026c3a2;
        (*pMVar4->_vptr_MessageGenerator[2])(pMVar4,printer,local_80);
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(this->file_ + 0x58));
    }
    io::Printer::Print(printer,"\n");
    pCVar5 = (this->context_).ptr_;
    if (pCVar5 != (Context *)0x0) {
      if (((pCVar5->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
        if (this->immutable_api_ == true) {
          GenerateDescriptorInitializationCodeForImmutable(this,printer);
        }
        else {
          GenerateDescriptorInitializationCodeForMutable(this,printer);
        }
      }
      else {
        io::Printer::Print(printer,"static {\n");
        io::Printer::Indent(printer);
        local_88[0] = 0;
        local_88[1] = 0;
        if (0 < *(int *)(this->file_ + 0x58)) {
          lVar12 = 0;
          do {
            psVar9 = internal::
                     scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                     ::operator[](&this->message_generators_,lVar12);
            pMVar4 = psVar9->ptr_;
            if (pMVar4 == (MessageGenerator *)0x0) goto LAB_0026c3a2;
            iVar7 = (*pMVar4->_vptr_MessageGenerator[3])(pMVar4,printer);
            local_88[0] = local_88[0] + iVar7;
            anon_unknown_0::MaybeRestartJavaMethod
                      (printer,local_88,local_88 + 1,"_clinit_autosplit_$method_num$();\n",
                       "private static void _clinit_autosplit_$method_num$() {\n");
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)(this->file_ + 0x58));
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      io::Printer::Print(printer,"\n// @@protoc_insertion_point(outer_class_scope)\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      return;
    }
  }
LAB_0026c3d0:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->() const [C = google::protobuf::compiler::java::Context]"
  ;
LAB_0026c3e5:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,__function);
LAB_0026c3b9:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::java::ExtensionGenerator]"
  ;
  goto LAB_0026c3e5;
LAB_0026c3a2:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->() const [C = google::protobuf::compiler::java::MessageGenerator]"
  ;
  goto LAB_0026c3e5;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
      "package $package$;\n"
      "\n",
      "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$', options_.annotate_code ? classname_ + ".java.pb.meta" : "");
  printer->Print(
      "public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
    "public static void registerAllExtensions(\n"
    "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
      "\n"
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistry registry) {\n"
      "  registerAllExtensions(\n"
      "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
      "}\n");
  }

  // -----------------------------------------------------------------

  if (!MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      } else {
        EnumLiteGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    } else {
      GenerateDescriptorInitializationCodeForMutable(printer);
    }
  } else {
    printer->Print(
      "static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_$method_num$();\n",
        "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}